

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O1

void FormatCmdHelp(char *buffer,ECommand_t cmd,char *description)

{
  char key;
  size_t sVar1;
  undefined4 in_register_00000034;
  char keyBuf [20];
  char keyBuf2 [10];
  char acStack_48 [4];
  undefined1 auStack_44 [26];
  char local_2a [10];
  
  key = DefaultKeys[(ulong)buffer & 0xffffffff];
  FormatKey(acStack_48,key);
  if (key != SecondaryKeys[(ulong)buffer & 0xffffffff]) {
    FormatKey(local_2a,SecondaryKeys[(ulong)buffer & 0xffffffff]);
    sVar1 = strlen(acStack_48);
    builtin_strncpy(acStack_48 + sVar1," or ",4);
    auStack_44[sVar1] = 0;
    strcat(acStack_48,local_2a);
  }
  sVar1 = strlen(HelpString);
  sprintf(HelpString + sVar1,"  %-10s .. %s\n",acStack_48,CONCAT44(in_register_00000034,cmd));
  return;
}

Assistant:

static void FormatCmdHelp(char* buffer, ECommand_t cmd, const char* description)
{
  char keyBuf[20];
  FormatKey(keyBuf, DefaultKeys[cmd]);

  if (DefaultKeys[cmd] != SecondaryKeys[cmd]) {
    char keyBuf2[10];
    FormatKey(keyBuf2, SecondaryKeys[cmd]);
    strcat(keyBuf, " or ");
    strcat(keyBuf, keyBuf2);
  }

  sprintf(&buffer[strlen(buffer)], "  %-10s .. %s\n", keyBuf, description);
}